

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t __thiscall
duckdb::BinaryUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
          (BinaryUhugeIntOperator *this,uhugeint_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  idx_t iVar2;
  ulong uVar3;
  char *pcVar4;
  uint64_t lower;
  uint64_t upper;
  hugeint_t value;
  hugeint_t hVar5;
  undefined1 auVar6 [16];
  string_t target;
  uhugeint_t local_30;
  
  local_30.lower = (uint64_t)this;
  local_30.upper = input.lower;
  hVar5 = duckdb::uhugeint_t::operator_cast_to_hugeint_t(&local_30);
  value.upper = hVar5.upper;
  value.lower = value.upper;
  iVar2 = CountZeros<duckdb::hugeint_t>::Leading((CountZeros<duckdb::hugeint_t> *)hVar5.lower,value)
  ;
  if (iVar2 == 0x80) {
    auVar6 = duckdb::StringVector::EmptyString((Vector *)input.upper,1);
    target.value.pointer.ptr = (char *)auVar6._8_8_;
    target.value._0_8_ = auVar6._0_8_;
    pcVar4 = target.value.pointer.ptr;
    if (auVar6._0_4_ < 0xd) {
      pcVar4 = target.value.pointer.prefix;
    }
    *pcVar4 = '0';
  }
  else {
    auVar6 = duckdb::StringVector::EmptyString((Vector *)input.upper,0x80 - iVar2);
    target.value.pointer.ptr = (char *)auVar6._8_8_;
    target.value._0_8_ = auVar6._0_8_;
    pcVar4 = target.value.pointer.ptr;
    if (auVar6._0_4_ < 0xd) {
      pcVar4 = target.value.pointer.prefix;
    }
    for (uVar3 = 0x7f - iVar2; 0x40 < uVar3 + 1; uVar3 = uVar3 - 1) {
      *pcVar4 = (input.lower >> ((ulong)((int)uVar3 - 0x40U & 0xff) & 0x3f) & 1) != 0 | 0x30;
      pcVar4 = pcVar4 + 1;
    }
    for (; uVar3 != 0xffffffffffffffff; uVar3 = uVar3 - 1) {
      *pcVar4 = ((ulong)this >> (uVar3 & 0x3f) & 1) != 0 | 0x30;
      pcVar4 = pcVar4 + 1;
    }
  }
  string_t::Finalize(&target);
  aVar1.pointer.ptr = target.value.pointer.ptr;
  aVar1._0_8_ = target.value._0_8_;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<uhugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 8 - num_leading_zero;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntBinBytes<uhugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}